

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O1

void gray_render_line(gray_PWorker worker,TPos to_x,TPos to_y)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long ey;
  int iVar12;
  long ex;
  ulong uVar13;
  ulong uVar14;
  int local_78;
  
  uVar14 = worker->y;
  ey = (long)uVar14 >> 8;
  lVar6 = to_y >> 8;
  if ((ey < worker->max_ey || lVar6 < worker->max_ey) &&
     (worker->min_ey <= ey || worker->min_ey <= lVar6)) {
    uVar1 = worker->x;
    ex = (long)uVar1 >> 8;
    uVar8 = uVar1 & 0xff;
    iVar7 = (int)uVar8;
    uVar13 = uVar14 & 0xff;
    if ((long)(uVar14 ^ to_y) >> 8 != 0 || (long)(uVar1 ^ to_x) >> 8 != 0) {
      if (to_y == uVar14) {
        gray_set_cell(worker,to_x >> 8,ey);
      }
      else {
        lVar10 = to_y - uVar14;
        if (to_x == uVar1) {
          if (lVar10 < 1) {
            do {
              ey = ey + -1;
              worker->cover = worker->cover - uVar13;
              worker->area = worker->area + (int)uVar13 * iVar7 * -2;
              gray_set_cell(worker,ex,ey);
              uVar13 = 0x100;
            } while (ey != lVar6);
          }
          else {
            lVar10 = 0x100 - uVar13;
            uVar13 = 0;
            do {
              ey = ey + 1;
              worker->cover = worker->cover + lVar10;
              worker->area = worker->area + (int)lVar10 * iVar7 * 2;
              gray_set_cell(worker,ex,ey);
              lVar10 = 0x100;
            } while (ey != lVar6);
          }
        }
        else {
          lVar9 = to_x - uVar1;
          iVar12 = (int)uVar13 * (int)lVar9 - (int)lVar10 * iVar7;
          lVar2 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar9),0);
          lVar3 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar10),0);
          lVar11 = lVar10 * 0x100;
          uVar14 = uVar13;
          do {
            lVar4 = (long)iVar12;
            iVar7 = (int)uVar8;
            if ((iVar12 < 1) && (lVar9 * 0x100 < lVar4)) {
              uVar13 = -((ulong)(uint)-iVar12 * lVar2) >> 0x38;
              worker->cover = worker->cover + (uVar13 - uVar14);
              worker->area = worker->area + iVar7 * (int)(uVar13 - uVar14);
              iVar12 = iVar12 + (int)lVar10 * -0x100;
              ex = ex + -1;
              uVar8 = 0x100;
            }
            else {
              lVar5 = lVar4 + lVar9 * -0x100;
              if ((lVar5 < 1) && (0 < lVar5 + lVar11)) {
                iVar12 = (int)lVar5;
                uVar8 = -iVar12 * lVar3;
                worker->cover = worker->cover + (0x100 - uVar14);
                worker->area = worker->area +
                               (int)(0x100 - uVar14) * (iVar7 + (uint)(byte)(uVar8 >> 0x38));
                ey = ey + 1;
                uVar13 = 0;
              }
              else {
                if ((lVar5 + lVar11 == 0 || SCARRY8(lVar5,lVar11) != lVar5 + lVar11 < 0) &&
                   (-1 < lVar11 + lVar4)) {
                  iVar12 = (int)(lVar11 + lVar4);
                  uVar13 = (ulong)(iVar12 * lVar2) >> 0x38;
                  worker->cover = worker->cover + (uVar13 - uVar14);
                  worker->area = worker->area + (int)(uVar13 - uVar14) * (iVar7 + 0x100);
                  ex = ex + 1;
                  uVar8 = 0;
                  goto LAB_00109cc7;
                }
                uVar8 = -(lVar4 * lVar3);
                worker->cover = worker->cover - uVar14;
                worker->area = worker->area - (int)uVar14 * (iVar7 + (uint)(byte)(uVar8 >> 0x38));
                local_78 = (int)(lVar9 * 0x100);
                iVar12 = iVar12 + local_78;
                ey = ey + -1;
                uVar13 = 0x100;
              }
              uVar8 = uVar8 >> 0x38;
            }
LAB_00109cc7:
            iVar7 = (int)uVar8;
            gray_set_cell(worker,ex,ey);
            uVar14 = uVar13;
          } while ((ex != to_x >> 8) || (ey != lVar6));
        }
      }
    }
    lVar6 = (to_y & 0xffU) - uVar13;
    worker->cover = worker->cover + lVar6;
    worker->area = worker->area + (int)lVar6 * (iVar7 + ((uint)to_x & 0xff));
  }
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void gray_render_line(RAS_ARG_ TPos to_x, TPos to_y)
{
    TPos   dx, dy, fx1, fy1, fx2, fy2;
    TCoord ex1, ex2, ey1, ey2;

    ex1 = TRUNC(ras.x);
    ex2 = TRUNC(to_x);
    ey1 = TRUNC(ras.y);
    ey2 = TRUNC(to_y);

    /* perform vertical clipping */
    if ((ey1 >= ras.max_ey && ey2 >= ras.max_ey) ||
        (ey1 < ras.min_ey && ey2 < ras.min_ey))
        goto End;

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    fx1 = ras.x - SUBPIXELS(ex1);
    fy1 = ras.y - SUBPIXELS(ey1);

    if (ex1 == ex2 && ey1 == ey2) /* inside one cell */
        ;
    else if (dy == 0) /* ex1 != ex2 */ /* any horizontal line */
    {
        ex1 = ex2;
        gray_set_cell(RAS_VAR_ ex1, ey1);
    } else if (dx == 0) {
        if (dy > 0) /* vertical line up */
            do {
                fy2 = ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * fx1 * 2;
                fy1 = 0;
                ey1++;
                gray_set_cell(RAS_VAR_ ex1, ey1);
            } while (ey1 != ey2);
        else /* vertical line down */
            do {
                fy2 = 0;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * fx1 * 2;
                fy1 = ONE_PIXEL;
                ey1--;
                gray_set_cell(RAS_VAR_ ex1, ey1);
            } while (ey1 != ey2);
    } else /* any other line */
    {
        TArea prod = dx * fy1 - dy * fx1;
        SW_FT_UDIVPREP(dx);
        SW_FT_UDIVPREP(dy);

        /* The fundamental value `prod' determines which side and the  */
        /* exact coordinate where the line exits current cell.  It is  */
        /* also easily updated when moving from one cell to the next.  */
        do {
            if (prod <= 0 && prod - dx * ONE_PIXEL > 0) /* left */
            {
                fx2 = 0;
                fy2 = (TPos)SW_FT_UDIV(-prod, -dx);
                prod -= dy * ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = ONE_PIXEL;
                fy1 = fy2;
                ex1--;
            } else if (prod - dx * ONE_PIXEL <= 0 &&
                       prod - dx * ONE_PIXEL + dy * ONE_PIXEL > 0) /* up */
            {
                prod -= dx * ONE_PIXEL;
                fx2 = (TPos)SW_FT_UDIV(-prod, dy);
                fy2 = ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = fx2;
                fy1 = 0;
                ey1++;
            } else if (prod - dx * ONE_PIXEL + dy * ONE_PIXEL <= 0 &&
                       prod + dy * ONE_PIXEL >= 0) /* right */
            {
                prod += dy * ONE_PIXEL;
                fx2 = ONE_PIXEL;
                fy2 = (TPos)SW_FT_UDIV(prod, dx);
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = 0;
                fy1 = fy2;
                ex1++;
            } else /* ( prod                  + dy * ONE_PIXEL <  0 &&
                        prod                                   >  0 )    down */
            {
                fx2 = (TPos)SW_FT_UDIV(prod, -dy);
                fy2 = 0;
                prod += dx * ONE_PIXEL;
                ras.cover += (fy2 - fy1);
                ras.area += (fy2 - fy1) * (fx1 + fx2);
                fx1 = fx2;
                fy1 = ONE_PIXEL;
                ey1--;
            }

            gray_set_cell(RAS_VAR_ ex1, ey1);
        } while (ex1 != ex2 || ey1 != ey2);
    }

    fx2 = to_x - SUBPIXELS(ex2);
    fy2 = to_y - SUBPIXELS(ey2);

    ras.cover += (fy2 - fy1);
    ras.area += (fy2 - fy1) * (fx1 + fx2);

End:
    ras.x = to_x;
    ras.y = to_y;
}